

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t __thiscall c4::yml::Tree::child(Tree *this,size_t node,size_t pos)

{
  code *pcVar1;
  bool bVar2;
  error_flags eVar3;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  size_t i;
  size_t count;
  char msg [29];
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  char *in_stack_ffffffffffffff58;
  Location *in_stack_ffffffffffffff60;
  size_t local_80;
  long local_78;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  char local_48 [40];
  long local_20;
  
  local_20 = in_RDX;
  if (in_RSI == -1) {
    builtin_strncpy(local_48,"check failed: (node != NONE)",0x1d);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    Location::Location(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    (*pcVar1)(local_48,0x1d,*(undefined8 *)(in_RDI + 0x40));
    in_stack_ffffffffffffff38 = local_70;
    in_stack_ffffffffffffff3c = uStack_6c;
    in_stack_ffffffffffffff40 = uStack_68;
    in_stack_ffffffffffffff44 = uStack_64;
  }
  local_78 = 0;
  local_80 = first_child((Tree *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  while( true ) {
    if (local_80 == 0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
    if (local_78 == local_20) break;
    local_80 = next_sibling((Tree *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    local_78 = local_78 + 1;
  }
  return local_80;
}

Assistant:

size_t Tree::child(size_t node, size_t pos) const
{
    _RYML_CB_ASSERT(m_callbacks, node != NONE);
    size_t count = 0;
    for(size_t i = first_child(node); i != NONE; i = next_sibling(i))
    {
        if(count++ == pos)
            return i;
    }
    return NONE;
}